

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortRangeInteraction.cpp
# Opt level: O1

void __thiscall OpenMD::ShortRangeInteraction::~ShortRangeInteraction(ShortRangeInteraction *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

ShortRangeInteraction::~ShortRangeInteraction() {}